

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ModalFilter.cpp
# Opt level: O2

int ModalFilter::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0x340);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"Random seed","",0.0,100000.0,0.0,1.0,1.0,0,
                    "Random seed, selects locations of modes and their bandwidth randomly");
  RegisterParameter(definition,"Num modes","",1.0,256.0,10.0,1.0,1.0,1,"Number of modes or partials"
                   );
  RegisterParameter(definition,"Freq shift","Hz",-3000.0,3000.0,0.0,1.0,1.0,2,
                    "Frequency shift in Hz");
  RegisterParameter(definition,"Freq shift var","Hz",-3000.0,3000.0,0.01,1.0,1.0,3,
                    "Randomized frequency shift in Hz");
  RegisterParameter(definition,"Freq scale","",-10.0,10.0,1.0,1.0,1.0,4,"Frequency scaling in Hz");
  RegisterParameter(definition,"Freq scale var","",-10.0,10.0,0.0,1.0,1.0,5,
                    "Randomized frequency scaling in Hz");
  RegisterParameter(definition,"BW scale","",0.001,10.0,1.0,1.0,1.0,6,"Bandwidth scaling factor");
  RegisterParameter(definition,"BW scale var","",0.001,10.0,0.001,1.0,1.0,7,
                    "Randomized bandwidth scaling factor");
  RegisterParameter(definition,"Gain scale","dB",-100.0,100.0,0.0,1.0,1.0,8,"Gain scaling in dB");
  RegisterParameter(definition,"Gain scale var","dB",-100.0,100.0,0.0,1.0,1.0,9,
                    "Randomized gain scaling in dB");
  RegisterParameter(definition,"ShowSpectrum","",0.0,1.0,0.0,1.0,1.0,10,
                    "Overlay input spectrum (green) and output spectrum (red)");
  RegisterParameter(definition,"SpectrumDecay","dB/s",-50.0,0.0,-10.0,1.0,1.0,0xb,
                    "Hold time for overlaid spectra");
  RegisterParameter(definition,"SpectrumOffset","dB",-100.0,100.0,0.0,1.0,1.0,0xc,
                    "Spectrum drawing offset in dB");
  return 0xd;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Random seed", "", 0.0f, 100000.0f, 0.0f, 1.0f, 1.0f, P_SEED, "Random seed, selects locations of modes and their bandwidth randomly");
        RegisterParameter(definition, "Num modes", "", 1.0f, MAXRESONATORS, 10.0f, 1.0f, 1.0f, P_NUMMODES, "Number of modes or partials");
        RegisterParameter(definition, "Freq shift", "Hz", -3000.0f, 3000.0f, 0.0f, 1.0f, 1.0f, P_FREQSHIFT, "Frequency shift in Hz");
        RegisterParameter(definition, "Freq shift var", "Hz", -3000.0f, 3000.0f, 0.01f, 1.0f, 1.0f, P_FREQSHIFTVAR, "Randomized frequency shift in Hz");
        RegisterParameter(definition, "Freq scale", "", -10.0f, 10.0f, 1.0f, 1.0f, 1.0f, P_FREQSCALE, "Frequency scaling in Hz");
        RegisterParameter(definition, "Freq scale var", "", -10.0f, 10.0f, 0.0f, 1.0, 1.0f, P_FREQSCALEVAR, "Randomized frequency scaling in Hz");
        RegisterParameter(definition, "BW scale", "", 0.001f, 10.0f, 1.0f, 1.0f, 1.0f, P_BWSCALE, "Bandwidth scaling factor");
        RegisterParameter(definition, "BW scale var", "", 0.001f, 10.0f, 0.001f, 1.0f, 1.0f, P_BWSCALEVAR, "Randomized bandwidth scaling factor");
        RegisterParameter(definition, "Gain scale", "dB", -100.0f, 100.0f, 0.0f, 1.0f, 1.0f, P_GAINSCALE, "Gain scaling in dB");
        RegisterParameter(definition, "Gain scale var", "dB", -100.0f, 100.0f, 0.0f, 1.0f, 1.0f, P_GAINSCALEVAR, "Randomized gain scaling in dB");
        RegisterParameter(definition, "ShowSpectrum", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_SHOWSPECTRUM, "Overlay input spectrum (green) and output spectrum (red)");
        RegisterParameter(definition, "SpectrumDecay", "dB/s", -50.0f, 0.0f, -10.0f, 1.0f, 1.0f, P_SPECTRUMDECAY, "Hold time for overlaid spectra");
        RegisterParameter(definition, "SpectrumOffset", "dB", -100.0f, 100.0f, 0.0f, 1.0f, 1.0f, P_SPECTRUMOFFSET, "Spectrum drawing offset in dB");
        return numparams;
    }